

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviewer.cpp
# Opt level: O2

bool __thiscall GraphViewer::rearrange(GraphViewer *this)

{
  Connection *this_00;
  bool bVar1;
  allocator local_31;
  string local_30;
  
  this_00 = this->con;
  std::__cxx11::string::string((string *)&local_30,"rearrange\n",&local_31);
  bVar1 = Connection::sendMsg(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool GraphViewer::rearrange() {
	return con->sendMsg("rearrange\n");
}